

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTestsUtil.cpp
# Opt level: O2

UVec3 __thiscall
vkt::pipeline::multisample::getShaderGridSize
          (multisample *this,ImageType imageType,UVec3 *imageSize,deUint32 mipLevel)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UVec3 UVar8;
  
  bVar2 = (byte)mipLevel;
  uVar5 = imageSize->m_data[0] >> (bVar2 & 0x1f);
  uVar5 = uVar5 + (uVar5 == 0);
  uVar4 = imageSize->m_data[1] >> (bVar2 & 0x1f);
  uVar4 = uVar4 + (uVar4 == 0);
  if (IMAGE_TYPE_BUFFER < imageType) {
    uVar5 = 1;
    uVar6 = uVar5;
    uVar3 = uVar5;
    goto LAB_0053bfaf;
  }
  uVar6 = imageSize->m_data[2];
  uVar3 = 1;
  uVar7 = uVar6;
  uVar1 = imageSize->m_data[0];
  switch(imageType) {
  case IMAGE_TYPE_1D:
    uVar1 = uVar5;
  case IMAGE_TYPE_BUFFER:
    uVar5 = uVar1;
    uVar6 = uVar3;
    goto LAB_0053bfaf;
  case IMAGE_TYPE_1D_ARRAY:
    goto LAB_0053bfaf;
  case IMAGE_TYPE_3D:
    uVar6 = uVar6 >> (bVar2 & 0x1f);
    uVar7 = uVar6 + (uVar6 == 0);
  case IMAGE_TYPE_2D_ARRAY:
    uVar6 = uVar4;
    uVar3 = uVar7;
    goto LAB_0053bfaf;
  case IMAGE_TYPE_CUBE:
    uVar3 = 6;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar3 = uVar6 * 6;
  }
  uVar6 = uVar4;
LAB_0053bfaf:
  *(uint *)this = uVar5;
  *(uint *)(this + 4) = uVar6;
  *(uint *)(this + 8) = uVar3;
  UVar8.m_data[2] = uVar3;
  UVar8.m_data._0_8_ = this;
  return (UVec3)UVar8.m_data;
}

Assistant:

tcu::UVec3 getShaderGridSize (const ImageType imageType, const tcu::UVec3& imageSize, const deUint32 mipLevel)
{
	const deUint32 mipLevelX = std::max(imageSize.x() >> mipLevel, 1u);
	const deUint32 mipLevelY = std::max(imageSize.y() >> mipLevel, 1u);
	const deUint32 mipLevelZ = std::max(imageSize.z() >> mipLevel, 1u);

	switch (imageType)
	{
	case IMAGE_TYPE_1D:
		return tcu::UVec3(mipLevelX, 1u, 1u);

	case IMAGE_TYPE_BUFFER:
		return tcu::UVec3(imageSize.x(), 1u, 1u);

	case IMAGE_TYPE_1D_ARRAY:
		return tcu::UVec3(mipLevelX, imageSize.z(), 1u);

	case IMAGE_TYPE_2D:
		return tcu::UVec3(mipLevelX, mipLevelY, 1u);

	case IMAGE_TYPE_2D_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, imageSize.z());

	case IMAGE_TYPE_3D:
		return tcu::UVec3(mipLevelX, mipLevelY, mipLevelZ);

	case IMAGE_TYPE_CUBE:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u);

	case IMAGE_TYPE_CUBE_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u * imageSize.z());

	default:
		DE_FATAL("Unknown image type");
		return tcu::UVec3(1u, 1u, 1u);
	}
}